

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall PhPacker_Arg_C_Test::TestBody(PhPacker_Arg_C_Test *this)

{
  uchar uVar1;
  uchar *puVar2;
  char *pcVar3;
  uchar result;
  uchar expected;
  AssertionResult gtest_ar;
  string str;
  uchar local_5a [2];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  undefined1 local_50 [8];
  _Storage local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  AssertHelper local_30;
  string local_28;
  
  PhPacker::pack<unsigned_char,_0>(&local_28,'C','{');
  PhPacker::unpack((PhPacker *)local_50,'C',&local_28);
  puVar2 = (uchar *)std::__any_caster<unsigned_char>((any *)local_50);
  if (puVar2 == (uchar *)0x0) {
    std::__throw_bad_any_cast();
  }
  uVar1 = *puVar2;
  if (local_50 != (undefined1  [8])0x0) {
    (*(code *)local_50)(3,local_50,0);
    local_50 = (undefined1  [8])0x0;
  }
  local_5a[1] = 0x7b;
  local_5a[0] = uVar1;
  testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
            ((internal *)local_50,"result","expected",local_5a,local_5a + 1);
  if (local_50[0] == (PhPacker)0x0) {
    testing::Message::Message((Message *)&local_58);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._M_ptr ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *local_48._M_ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x1a4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_58);
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._M_ptr !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_50 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_48._M_ptr);
    }
    PhPacker::pack<unsigned_char,_0>((string *)local_50,'C',200);
    std::__cxx11::string::operator=((string *)&local_28,(string *)local_50);
    if (local_50 != (undefined1  [8])(local_50 + 0x10)) {
      operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
    }
    PhPacker::unpack((PhPacker *)local_50,'C',&local_28);
    puVar2 = (uchar *)std::__any_caster<unsigned_char>((any *)local_50);
    if (puVar2 == (uchar *)0x0) {
      std::__throw_bad_any_cast();
    }
    local_5a[0] = *puVar2;
    if (local_50 != (undefined1  [8])0x0) {
      (*(code *)local_50)(3,local_50,0);
      local_50 = (undefined1  [8])0x0;
    }
    local_5a[1] = 200;
    testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
              ((internal *)local_50,"result","expected",local_5a,local_5a + 1);
    if (local_50[0] != (PhPacker)0x0) goto LAB_001120ee;
    testing::Message::Message((Message *)&local_58);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._M_ptr ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *local_48._M_ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x1a9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_58);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  if (local_58._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_58._M_head_impl + 8))();
  }
LAB_001120ee:
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._M_ptr !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_50 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_48._M_ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(PhPacker, Arg_C)
{
   std::string str = PhPacker::pack<unsigned char>('C', 123);
   unsigned char result = std::any_cast<unsigned char>(PhPacker::unpack('C', str));
   unsigned char expected = 123;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<unsigned char>('C', 200);
   result = std::any_cast<unsigned char>(PhPacker::unpack('C', str));
   expected = 200;
   GTEST_ASSERT_EQ(result, expected);
}